

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.h
# Opt level: O0

void __thiscall Net::Train(Net *this)

{
  float fVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  ReturnType RVar7;
  float fVar8;
  double dVar9;
  ulong local_1a8;
  size_t j_4;
  size_t h_4;
  size_t j_3;
  size_t h_3;
  size_t h_2;
  size_t i;
  double local_148;
  double temp;
  size_t h_1;
  size_t j_2;
  size_t j_1;
  undefined1 local_120 [4];
  float SUM;
  ColXpr local_f0;
  double local_c0;
  double beta_j;
  size_t j;
  ColXpr local_78;
  double local_48;
  double alpha_h;
  size_t h;
  undefined1 local_28 [8];
  MatrixXf cur;
  Net *this_local;
  
  cur.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = (Index)this
  ;
  Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<float,12,6,0,12,6>>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_28,
             (EigenBase<Eigen::Matrix<float,_12,_6,_0,_12,_6>_> *)&this->pool2);
  Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_28,0x48,1);
  for (alpha_h = 0.0; (ulong)alpha_h < 0x40; alpha_h = (double)((long)alpha_h + 1)) {
    Eigen::DenseBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>::col
              (&local_78,(DenseBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_> *)&this->v,
               (Index)alpha_h);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::col
              ((ColXpr *)&j,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_28,0);
    RVar7 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,72,64,0,72,64>,72,1,true>>::
            dot<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<float,72,64,0,72,64>,72,1,true>> *)
                       &local_78,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                        *)&j);
    local_48 = (double)RVar7;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1> *)&this->r,
                        (Index)alpha_h,0);
    dVar9 = exp(-((double)RVar7 - (double)*pSVar2));
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)&this->b,
                        (Index)alpha_h,0);
    *pSVar3 = (float)(1.0 / (dVar9 + 1.0));
  }
  for (beta_j = 0.0; (ulong)beta_j < 0x23; beta_j = (double)((long)beta_j + 1)) {
    local_c0 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>::col
              (&local_f0,(DenseBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_> *)&this->w,
               (Index)beta_j);
    Eigen::DenseBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>::col
              ((ColXpr *)local_120,(DenseBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_> *)&this->b,0);
    RVar7 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,35,0,64,35>,64,1,true>>::
            dot<Eigen::Block<Eigen::Matrix<float,64,1,0,64,1>,64,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,35,0,64,35>,64,1,true>> *)
                       &local_f0,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>_>
                        *)local_120);
    local_c0 = (double)RVar7;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->o,
                        (Index)beta_j,0);
    dVar9 = exp((double)RVar7 - (double)*pSVar4);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->yc,
                        (Index)beta_j,0);
    *pSVar4 = (float)dVar9;
  }
  j_1._4_4_ = Eigen::DenseBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>::sum
                        ((DenseBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_> *)&this->yc);
  for (j_2 = 0; j_2 < 0x23; j_2 = j_2 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->yc,j_2,0
                       );
    fVar8 = *pSVar4 / j_1._4_4_;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->yc,j_2,0
                       );
    *pSVar4 = fVar8;
  }
  this->ek = 0.0;
  for (h_1 = 0; h_1 < 0x23; h_1 = h_1 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->yc,h_1);
    fVar8 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->y,h_1);
    fVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->g,h_1);
    *pSVar4 = fVar8 - fVar1;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->y,h_1);
    fVar8 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->yc,h_1);
    dVar9 = std::log((double)(ulong)(uint)*pSVar4);
    this->ek = this->ek - (double)(fVar8 * SUB84(dVar9,0));
  }
  for (temp = 0.0; (ulong)temp < 0x40; temp = (double)((long)temp + 1)) {
    local_148 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>::row
              ((RowXpr *)&i,(DenseBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_> *)&this->w,
               (Index)temp);
    RVar7 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,35,0,64,35>,1,35,false>>::
            dot<Eigen::Matrix<float,35,1,0,35,1>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,35,0,64,35>,1,35,false>> *)&i
                       ,(MatrixBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_> *)&this->g);
    local_148 = (double)RVar7;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)&this->b,
                        (Index)temp);
    fVar8 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)&this->b,
                        (Index)temp);
    dVar9 = (double)(fVar8 * (1.0 - *pSVar3)) * local_148;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)&this->e,
                        (Index)temp);
    *pSVar3 = (float)dVar9;
  }
  for (h_2 = 0; h_2 < 0x48; h_2 = h_2 + 1) {
    for (h_3 = 0; h_3 < 0x40; h_3 = h_3 + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)&this->e,h_3)
      ;
      fVar8 = *pSVar3;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1> *)&this->x,h_2)
      ;
      fVar1 = *pSVar2;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_1> *)&this->v,
                          h_2,h_3);
      *pSVar5 = -(fVar8 * 0.3) * fVar1 + *pSVar5;
    }
  }
  for (j_3 = 0; j_3 < 0x40; j_3 = j_3 + 1) {
    for (h_4 = 0; h_4 < 0x23; h_4 = h_4 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->g,h_4)
      ;
      fVar8 = *pSVar4;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)&this->b,j_3)
      ;
      fVar1 = *pSVar3;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1> *)&this->w,
                          j_3,h_4);
      *pSVar6 = -(fVar8 * 0.4) * fVar1 + *pSVar6;
    }
  }
  for (j_4 = 0; j_4 < 0x40; j_4 = j_4 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)&this->e,j_4);
    fVar8 = *pSVar3;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1> *)&this->r,j_4);
    *pSVar2 = fVar8 * -0.3 + *pSVar2;
  }
  for (local_1a8 = 0; local_1a8 < 0x23; local_1a8 = local_1a8 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->g,
                        local_1a8);
    fVar8 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->o,
                        local_1a8);
    *pSVar4 = fVar8 * -0.4 + *pSVar4;
  }
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_28);
  return;
}

Assistant:

void Net::Train()
{
    //pool2.normalize();// use sigmod for hidden layer
    MatrixXf cur = pool2;
    cur.resize(D,1);

    /* Compute b[h], hidden layer output */
    for (size_t h = 0; h < Q; h++) {
        double alpha_h = v.col(h).dot(cur.col(0));
//        double alpha_h = 0;
//        for (size_t i = 0; i < D; i++)
//            alpha_h += v(i,h) * cur(i,0);
        b(h,0) = ACTIVE(alpha_h - r(h,0));
    }

    /* Compute yc[j] ,output layer output */
    for (size_t j = 0; j < L; j++) {
        double beta_j = 0;
        beta_j = w.col(j).dot(b.col(0));
//        for (size_t h = 0; h < Q; h++)
//            beta_j += w[h][j] * b[h];
        yc(j,0) = exp(beta_j - o(j,0));
    }
    /*softmax activation*/
    float SUM = yc.sum();
    for (size_t j = 0; j < L; j++)
    {
        yc(j,0) = yc(j,0)/SUM;
    }

    ek = 0;

    /* Compute g[j] and E ,g[i] is the output layer point loss, Ek is the output layer loss*/
    for (size_t j = 0; j < L; j++) {
        g[j] =  (yc[j] - y[j]);// update b for output layer, when update the b, plus g
        ek -= y[j]*log(yc[j]); //
    }

    /* Compute e[h] , e[h] is the hidden layer loss*/
    for (size_t h = 0; h < Q; h++) {
        double temp = 0;
        temp = w.row(h).dot(g);
        e[h] = b[h] * (1 - b[h]) * temp;
    }

    /* Update v[i][h], w[h][j], r[h], o[j] */
    for (size_t i = 0; i < D; i++)
        for (size_t h = 0; h < Q; h++)
            v(i,h) -= LEARN_RATE1 * e[h] * x[i];
    for (size_t h = 0; h < Q; h++)
        for (size_t j = 0; j < L; j++)
            w(h,j) -= LEARN_RATE2 * g[j] * b[h];

    for (size_t h = 0; h < Q; h++)
        r[h] -= ((LEARN_RATE1) * e[h]);

    for (size_t j = 0; j < L; j++)
        o[j] -= ((LEARN_RATE2) * g[j]);
}